

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

int __thiscall asl::Array<asl::String>::dup(Array<asl::String> *this,int __fd)

{
  int *piVar1;
  String *in_RAX;
  String *p;
  Array<asl::String> b;
  Array<asl::String> local_18;
  
  p = this->_a;
  if (*(int *)((long)&p[-1].field_2 + 8) != 1) {
    local_18._a = in_RAX;
    Array(&local_18,p,*(int *)&p[-1].field_2);
    if (this->_a != local_18._a) {
      LOCK();
      piVar1 = (int *)((long)&this->_a[-1].field_2 + 8);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        free(this,p);
      }
      this->_a = (String *)local_18;
      LOCK();
      piVar1 = (int *)((long)&local_18._a[-1].field_2 + 8);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    ~Array(&local_18);
  }
  return (int)this;
}

Assistant:

Array& dup()
	{
		if(d().rc==1) return *this;
		return (*this = clone());
	}